

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void listener_add_address_space(MemoryListener *listener,AddressSpace *as)

{
  FlatView *fv;
  undefined1 local_68 [8];
  MemoryRegionSection section;
  FlatRange *fr;
  FlatView *view;
  AddressSpace *as_local;
  MemoryListener *listener_local;
  
  if (listener->begin != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->begin)(listener);
  }
  fv = address_space_get_flatview_tricore(as);
  section._56_8_ = fv->ranges;
  while( true ) {
    if (fv->ranges + fv->nr <= (ulong)section._56_8_) break;
    section_from_flat_range((MemoryRegionSection *)local_68,(FlatRange *)section._56_8_,fv);
    if (listener->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
      (*listener->region_add)(listener,(MemoryRegionSection *)local_68);
    }
    section._56_8_ = section._56_8_ + 0x40;
  }
  if (listener->commit != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->commit)(listener);
  }
  return;
}

Assistant:

static void listener_add_address_space(MemoryListener *listener,
                                       AddressSpace *as)
{
    FlatView *view;
    FlatRange *fr;

    if (listener->begin) {
        listener->begin(listener);
    }

    view = address_space_get_flatview(as);
    FOR_EACH_FLAT_RANGE(fr, view) {
        MemoryRegionSection section = section_from_flat_range(fr, view);

        if (listener->region_add) {
            listener->region_add(listener, &section);
        }
    }
    if (listener->commit) {
        listener->commit(listener);
    }
}